

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

TimerId __thiscall mario::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  Timestamp TVar1;
  TimerId TVar2;
  Timestamp local_20;
  
  TVar1 = Timestamp::now();
  Timestamp::Timestamp(&local_20,(long)(interval * 1000000.0) + TVar1._microSecondsSinceEpoch);
  TVar2 = TimerQueue::addTimer
                    ((this->_timerQueue)._M_t.
                     super___uniq_ptr_impl<mario::TimerQueue,_std::default_delete<mario::TimerQueue>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mario::TimerQueue_*,_std::default_delete<mario::TimerQueue>_>
                     .super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl,cb,local_20,
                     interval);
  return TVar2;
}

Assistant:

TimerId EventLoop::runEvery(double interval, const TimerCallback& cb) {
    Timestamp time(addTime(Timestamp::now(), interval));
    return _timerQueue->addTimer(cb, time, interval);
}